

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3DeferToken(Fts3Cursor *pCsr,Fts3PhraseToken *pToken,int iCol)

{
  Fts3DeferredToken *__s;
  Fts3DeferredToken *pDeferred;
  int iCol_local;
  Fts3PhraseToken *pToken_local;
  Fts3Cursor *pCsr_local;
  
  __s = (Fts3DeferredToken *)sqlite3_malloc(0x20);
  if (__s == (Fts3DeferredToken *)0x0) {
    pCsr_local._4_4_ = 7;
  }
  else {
    memset(__s,0,0x20);
    __s->pToken = pToken;
    __s->pNext = pCsr->pDeferred;
    __s->iCol = iCol;
    pCsr->pDeferred = __s;
    pToken->pDeferred = __s;
    pCsr_local._4_4_ = 0;
  }
  return pCsr_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3DeferToken(
  Fts3Cursor *pCsr,               /* Fts3 table cursor */
  Fts3PhraseToken *pToken,        /* Token to defer */
  int iCol                        /* Column that token must appear in (or -1) */
){
  Fts3DeferredToken *pDeferred;
  pDeferred = sqlite3_malloc(sizeof(*pDeferred));
  if( !pDeferred ){
    return SQLITE_NOMEM;
  }
  memset(pDeferred, 0, sizeof(*pDeferred));
  pDeferred->pToken = pToken;
  pDeferred->pNext = pCsr->pDeferred; 
  pDeferred->iCol = iCol;
  pCsr->pDeferred = pDeferred;

  assert( pToken->pDeferred==0 );
  pToken->pDeferred = pDeferred;

  return SQLITE_OK;
}